

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void notch::core::Init::uniformNguyenWidrow
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Array *weights,int nIn,int nOut)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = pow((double)nOut,(double)(1.0 / (float)nIn));
  sVar1 = weights->_M_size;
  if (sVar1 == (long)(nOut * nIn)) {
    dVar6 = (double)nIn / 3.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    pfVar2 = weights->_M_data;
    pfVar3 = pfVar2 + weights->_M_size;
    if (weights->_M_size == 0) {
      pfVar3 = (float *)0x0;
      pfVar2 = (float *)0x0;
    }
    if (pfVar2 != pfVar3) {
      do {
        fVar4 = ::std::
                generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          ((rng->_M_t).
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                           ._M_head_impl);
        *pfVar2 = ((fVar4 + fVar4 + -1.0) * (float)(dVar5 * 0.699999988079071)) / (float)dVar6;
        pfVar2 = pfVar2 + 1;
      } while (pfVar2 != pfVar3);
    }
  }
  else {
    pfVar2 = weights->_M_data;
    pfVar3 = pfVar2 + sVar1;
    if (sVar1 == 0) {
      pfVar2 = (float *)0x0;
      pfVar3 = (float *)0x0;
    }
    for (; pfVar2 != pfVar3; pfVar2 = pfVar2 + 1) {
      fVar4 = ::std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        ((rng->_M_t).
                         super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                         .
                         super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                         ._M_head_impl);
      *pfVar2 = (fVar4 + fVar4 + -1.0) * (float)(dVar5 * 0.699999988079071);
    }
  }
  return;
}

Assistant:

static
    void uniformNguyenWidrow(std::unique_ptr<RNG> &rng,
                             Array &weights, int nIn, int nOut) {
        std::uniform_real_distribution<float> U(-1, +1);
        float overlap = 0.7f; // "to have the intervals overlap slightly"
        float beta = overlap * pow(nOut, 1.0f / nIn); // target row norm
        if (weights.size() == static_cast<size_t>(nIn*nOut)) {
            // we're initializing weights
            float w_row_norm = sqrt(nIn / 3.0); // for nIn elems in U([-1,1])
            std::generate(std::begin(weights), std::end(weights),
                    [&U, &rng, beta, w_row_norm] {
                        // w_{ji} in U([-1,1])
                        float w_ji = U(*rng.get());
                        // to have row norm equal beta
                        return w_ji * beta / w_row_norm;
                    });
        } else { // we're initializing bias
            // b_i = uniform random number in [-beta, beta]
            std::generate(std::begin(weights), std::end(weights),
                    [&U, &rng, beta] {
                        float u = U(*rng.get());
                        return u * beta;
                    });
         }
    }